

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

exr_result_t exr_attr_string_destroy(exr_context_t ctxt,exr_attr_string_t *s)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = 0;
    if (s != (exr_attr_string_t *)0x0) {
      if ((s->str != (char *)0x0) && (0 < s->alloc_size)) {
        (**(code **)(ctxt + 0x60))();
      }
      s->length = 0;
      s->alloc_size = 0;
      s->str = (char *)0x0;
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_destroy (exr_context_t ctxt, exr_attr_string_t* s)
{
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (s)
    {
        exr_attr_string_t nil = {0};
        if (s->str && s->alloc_size > 0)
            pctxt->free_fn ((char*) (uintptr_t) s->str);
        *s = nil;
    }
    return EXR_ERR_SUCCESS;
}